

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx.h
# Opt level: O0

int glad_glx_has_extension(Display *display,int screen,char *ext)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDX;
  int in_ESI;
  Display *in_RDI;
  char *extensions;
  char *loc;
  char *terminator;
  char *local_38;
  int local_4;
  
  if (sf_glad_glXQueryExtensionsString == (PFNGLXQUERYEXTENSIONSSTRINGPROC)0x0) {
    local_4 = 0;
  }
  else {
    local_38 = (*sf_glad_glXQueryExtensionsString)(in_RDI,in_ESI);
    if ((local_38 == (char *)0x0) || (in_RDX == (char *)0x0)) {
      local_4 = 0;
    }
    else {
      do {
        pcVar1 = strstr(local_38,in_RDX);
        if (pcVar1 == (char *)0x0) {
          return 0;
        }
        sVar2 = strlen(in_RDX);
        pcVar3 = pcVar1 + sVar2;
      } while (((pcVar1 != local_38) && (local_38 = pcVar3, pcVar1[-1] != ' ')) ||
              ((*pcVar3 != ' ' && (local_38 = pcVar3, *pcVar3 != '\0'))));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int glad_glx_has_extension(Display *display, int screen, const char *ext) {
#ifndef GLX_VERSION_1_1
    (void) display;
    (void) screen;
    (void) ext;
#else
    const char *terminator;
    const char *loc;
    const char *extensions;

    if (glXQueryExtensionsString == NULL) {
        return 0;
    }

    extensions = glXQueryExtensionsString(display, screen);

    if(extensions == NULL || ext == NULL) {
        return 0;
    }

    while(1) {
        loc = strstr(extensions, ext);
        if(loc == NULL)
            break;

        terminator = loc + strlen(ext);
        if((loc == extensions || *(loc - 1) == ' ') &&
            (*terminator == ' ' || *terminator == '\0')) {
            return 1;
        }
        extensions = terminator;
    }
#endif

    return 0;
}